

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_insert_success_endIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  void *_ck_x_6;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_4;
  char *_ck_x_5;
  intmax_t _ck_y_3;
  intmax_t _ck_x_4;
  void *_ck_x_3;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  code *pcStack_68;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  int _i_local;
  
  array.buffer._4_4_ = _i;
  memcpy(&stack0xffffffffffffff98,&PTR_private_ACUtilsTest_ADynArray_realloc_001a70f0,0x30);
  array.growStrategy = (ACUtilsGrowStrategy)0x5;
  array.deallocator = private_ACUtilsTest_ADynArray_growStrategy;
  array.size = 8;
  private_ACUtilsTest_ADynArray_reallocFail = false;
  array.capacity = (*pcStack_68)(0,8);
  *(undefined4 *)array.capacity = 0x33323130;
  *(undefined1 *)(array.capacity + 4) = 0x34;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  _ck_x._7_1_ = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray
                    (&stack0xffffffffffffff98,5,(void *)((long)&_ck_x + 7),1,1);
  if ((ulong)bVar1 != 1) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x284,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_insertArray(&array, 5, &(c), 1, sizeof(*(&array)->buffer)) == true"
                      ,
                      "private_ACUtils_ADynArray_insertArray(&array, 5, &(c), 1, sizeof(*(&array)->buffer))"
                      ,(ulong)bVar1,"true",1,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x284);
  if (array.growStrategy != (ACUtilsGrowStrategy)0x6) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x285,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.size == 6","array.size"
                      ,array.growStrategy,"6",6,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x285);
  if (array.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x286,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.capacity == 8",
                      "array.capacity",array.size,"8",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x286);
  if (array.capacity != 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x287);
    if ((long)*(char *)(array.capacity + 5) != 0) {
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x288,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %jd, %s == %jd","array.buffer[5] == \'\\0\'"
                        ,"array.buffer[5]",(long)*(char *)(array.capacity + 5),"\'\\0\'",0,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x288);
    _ck_y_s = (char *)array.capacity;
    if (array.capacity == 0) {
      _ck_y_q = "";
      _ck_y_s = "(null)";
    }
    else {
      _ck_y_q = "\"";
      iVar2 = strcmp("01234",(char *)array.capacity);
      if (iVar2 == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x289);
        if (array.deallocator == (ACUtilsDeallocator)0x0) {
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x28a,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",
                            "(void*) array.growStrategy != NULL","(void*) array.growStrategy",0,0);
        }
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x28a);
        if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
          sVar3 = 0x28b;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x28b);
          (*array.reallocator)((void *)array.capacity,sVar3);
          return;
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x28b,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtilsTest_ADynArray_reallocCount == 0",
                          "private_ACUtilsTest_ADynArray_reallocCount",
                          private_ACUtilsTest_ADynArray_reallocCount,"0",0,0);
      }
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x289,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "array.buffer == \"01234\"","array.buffer",_ck_y_q,_ck_y_s,_ck_y_q,"\"01234\""
                      ,"\"","01234","\"",0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x287,"Assertion \'_ck_x != NULL\' failed","Assertion \'%s\' failed: %s == %#x"
                    ,"(void*) array.buffer != NULL","(void*) array.buffer",0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insert_success_endIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insert(&array, 5, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 6);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[5], '\0');
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}